

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseTerminalBracketsOrUnary(Parser *this)

{
  Allocator *this_00;
  Allocator *pAVar1;
  _List_node_base *p_Var2;
  pointer pFVar3;
  pointer pFVar4;
  iterator iVar5;
  AST *pAVar6;
  LiteralString *pLVar7;
  StaticError *pSVar8;
  uint *while_;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *pvVar9;
  bool got_comma;
  Token field_id;
  AST *index;
  AST *obj;
  Token tok;
  AST *first;
  Fodder id_fodder;
  Identifier *id;
  AST *inner;
  bool local_559;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  _Alloc_hider local_538;
  undefined1 auStack_530 [24];
  _Alloc_hider local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  _Alloc_hider local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  LocationRange local_4d8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_498;
  undefined1 local_478 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  _Alloc_hider local_458;
  unsigned_long uStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8 [2];
  unsigned_long local_3c8;
  unsigned_long uStack_3c0;
  Token local_2f0;
  AST *local_230;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  unsigned_long uStack_200;
  unsigned_long local_1f8;
  unsigned_long uStack_1f0;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  local_1e8;
  undefined1 local_1c8 [16];
  AST local_1b8;
  unsigned_long local_118;
  unsigned_long uStack_110;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_108;
  Token local_f0;
  
  Token::Token(&local_2f0,
               (Token *)((this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::_M_erase
            (this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
  while_ = &switchD_00198f2e::switchdataD_00244ef8;
  switch(local_2f0.kind) {
  case BRACE_L:
    parseObjectRemainder(&local_f0,this,(AST **)local_478,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.location.file._M_dataplus._M_p != &local_f0.location.file.field_2) {
      operator_delete(local_f0.location.file._M_dataplus._M_p,
                      local_f0.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.stringBlockTermIndent._M_dataplus._M_p !=
        &local_f0.stringBlockTermIndent.field_2) {
      operator_delete(local_f0.stringBlockTermIndent._M_dataplus._M_p,
                      local_f0.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.stringBlockIndent._M_dataplus._M_p != &local_f0.stringBlockIndent.field_2) {
      operator_delete(local_f0.stringBlockIndent._M_dataplus._M_p,
                      local_f0.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.data._M_dataplus._M_p != &local_f0.data.field_2) {
      operator_delete(local_f0.data._M_dataplus._M_p,local_f0.data.field_2._M_allocated_capacity + 1
                     );
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_f0.fodder);
    pLVar7 = (LiteralString *)local_478._0_8_;
    goto LAB_0019a27d;
  case BRACE_R:
  case BRACKET_R:
  case COMMA:
  case DOT:
  case PAREN_R:
  case SEMICOLON:
  case ASSERT:
  case ELSE:
  case ERROR:
  case FOR:
  case FUNCTION:
  case IF:
  case IMPORT:
  case IMPORTSTR:
  case IMPORTBIN:
  case IN:
  case LOCAL:
  case TAILSTRICT:
  case THEN:
    pSVar8 = (StaticError *)__cxa_allocate_exception(0x60);
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"parsing terminal","");
    unexpected(pSVar8,(Parser *)&local_2f0,(Token *)local_478,(string *)while_);
    __cxa_throw(pSVar8,&StaticError::typeinfo,StaticError::~StaticError);
  case BRACKET_L:
    Token::Token((Token *)local_558,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    if (local_558._0_4_ == BRACKET_R) {
      Token::Token((Token *)local_478,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      pAVar1 = this->alloc;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_2f0.location.file._M_dataplus._M_p,
                 local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length
                );
      local_1b8.location.file._M_string_length = local_2f0.location.begin.line;
      local_1b8.location.file.field_2._M_allocated_capacity = local_2f0.location.begin.column;
      local_1b8.location.file.field_2._8_8_ = local_4d8.end.line;
      local_1b8.location.begin.line = local_4d8.end.column;
      local_228._0_8_ = (pointer)0x0;
      local_228._8_8_ = (pointer)0x0;
      local_228._16_8_ = (pointer)0x0;
      local_498.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_498.
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      pvVar9 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)(local_478 + 8);
      pLVar7 = (LiteralString *)
               Allocator::
               make<jsonnet::internal::Array,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                         (pAVar1,(LocationRange *)local_1c8,&local_2f0.fodder,
                          (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                           *)local_228,(bool *)&local_498,pvVar9);
      std::
      vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
      ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                 *)local_228);
      if ((AST *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(long)local_1b8._vptr_AST + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_p != local_3e8) {
        operator_delete(local_3f8._M_p,local_3e8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_p != &local_448) {
        operator_delete(local_458._M_p,local_448._0_8_ + 1);
      }
    }
    else {
      local_230 = parse(this,0xf);
      local_559 = false;
      local_498.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_498.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_498.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var2 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      local_558._0_4_ = *(undefined4 *)&p_Var2[1]._M_next;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)(local_558 + 8),
                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)((long)(p_Var2 + 1) + 8));
      std::__cxx11::string::_M_assign((string *)&local_538);
      std::__cxx11::string::_M_assign((string *)&local_518);
      std::__cxx11::string::_M_assign((string *)&local_4f8);
      std::__cxx11::string::_M_assign((string *)&local_4d8);
      local_4d8.begin.line = (unsigned_long)p_Var2[0xb]._M_next;
      local_4d8.begin.column = *(unsigned_long *)((long)(p_Var2 + 0xb) + 8);
      local_4d8.end.line = (unsigned_long)p_Var2[0xc]._M_next;
      local_4d8.end.column = *(unsigned_long *)((long)(p_Var2 + 0xc) + 8);
      if ((local_559 == false) && (local_558._0_4_ == COMMA)) {
        pop((Token *)local_478,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&local_498,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)(local_478 + 8));
        Token::operator=((Token *)local_558,
                         (Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
        local_559 = true;
        Token::~Token((Token *)local_478);
      }
      if (local_558._0_4_ == FOR) {
        pop((Token *)local_478,this);
        local_1e8.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector(&local_108,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)(local_478 + 8));
        parseComprehensionSpecs((Token *)local_1c8,this,BRACKET_R,&local_108,&local_1e8);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_108);
        pAVar1 = this->alloc;
        local_228._0_8_ = (pointer)(local_228 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,local_2f0.location.file._M_dataplus._M_p,
                   local_2f0.location.file._M_dataplus._M_p +
                   local_2f0.location.file._M_string_length);
        local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0.location.begin.line;
        uStack_200 = local_2f0.location.begin.column;
        local_1f8 = local_118;
        uStack_1f0 = uStack_110;
        pLVar7 = (LiteralString *)
                 Allocator::
                 make<jsonnet::internal::ArrayComprehension,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                           (pAVar1,(LocationRange *)local_228,&local_2f0.fodder,&local_230,
                            &local_498,&local_559,&local_1e8,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)(local_1c8 + 8));
        if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
        }
        Token::~Token((Token *)local_1c8);
        std::
        vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ::~vector(&local_1e8);
        Token::~Token((Token *)local_478);
      }
      else {
        local_228._0_8_ = (pointer)0x0;
        local_228._8_8_ = (pointer)0x0;
        local_228._16_8_ = (pointer)0x0;
        std::
        vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
        ::
        emplace_back<jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                  ((vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
                    *)local_228,&local_230,&local_498);
        if (local_558._0_4_ != BRACKET_R) {
          do {
            if (local_559 == false) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_478);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_478 + 0x10),"expected a comma before next array element."
                         ,0x2b);
              pSVar8 = (StaticError *)__cxa_allocate_exception(0x60);
              std::__cxx11::stringbuf::str();
              StaticError::StaticError(pSVar8,&local_4d8,(string *)local_1c8);
              __cxa_throw(pSVar8,&StaticError::typeinfo,StaticError::~StaticError);
            }
            local_1c8._0_8_ = parse(this,0xf);
            pFVar4 = local_498.
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pFVar3 = local_498.
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar6 = (AST *)local_498.
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            ._M_impl.super__Vector_impl_data._M_start;
            if (local_498.
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_498.
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&(pAVar6->location).file._M_string_length);
                pAVar6 = (AST *)&(pAVar6->location).begin;
              } while (pAVar6 != (AST *)pFVar4);
              local_498.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_finish = pFVar3;
            }
            local_559 = false;
            p_Var2 = (this->tokens->
                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                     )._M_impl._M_node.super__List_node_base._M_next;
            local_558._0_4_ = *(undefined4 *)&p_Var2[1]._M_next;
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)(local_558 + 8),
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)((long)(p_Var2 + 1) + 8));
            std::__cxx11::string::_M_assign((string *)&local_538);
            std::__cxx11::string::_M_assign((string *)&local_518);
            std::__cxx11::string::_M_assign((string *)&local_4f8);
            std::__cxx11::string::_M_assign((string *)&local_4d8);
            local_4d8.begin.line = (unsigned_long)p_Var2[0xb]._M_next;
            local_4d8.begin.column = *(unsigned_long *)((long)(p_Var2 + 0xb) + 8);
            local_4d8.end.line = (unsigned_long)p_Var2[0xc]._M_next;
            local_4d8.end.column = *(unsigned_long *)((long)(p_Var2 + 0xc) + 8);
            if (local_558._0_4_ == COMMA) {
              Token::Token((Token *)local_478,
                           (Token *)((this->tokens->
                                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                     )._M_impl._M_node.super__List_node_base._M_next + 1));
              std::__cxx11::
              list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::_M_erase
                        (this->tokens,
                         (this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
              std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::operator=(&local_498,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)(local_478 + 8));
              p_Var2 = (this->tokens->
                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                       )._M_impl._M_node.super__List_node_base._M_next;
              local_558._0_4_ = *(undefined4 *)&p_Var2[1]._M_next;
              std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)(local_558 + 8),
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)((long)(p_Var2 + 1) + 8));
              std::__cxx11::string::_M_assign((string *)&local_538);
              std::__cxx11::string::_M_assign((string *)&local_518);
              std::__cxx11::string::_M_assign((string *)&local_4f8);
              std::__cxx11::string::_M_assign((string *)&local_4d8);
              local_4d8.begin.line = (unsigned_long)p_Var2[0xb]._M_next;
              local_4d8.begin.column = *(unsigned_long *)((long)(p_Var2 + 0xb) + 8);
              local_4d8.end.line = (unsigned_long)p_Var2[0xc]._M_next;
              local_4d8.end.column = *(unsigned_long *)((long)(p_Var2 + 0xc) + 8);
              local_559 = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_p != local_3e8) {
                operator_delete(local_3f8._M_p,local_3e8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_p != &local_408) {
                operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_p != &local_428) {
                operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_p != &local_448) {
                operator_delete(local_458._M_p,local_448._0_8_ + 1);
              }
              std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)(local_478 + 8));
            }
            std::
            vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
            ::
            emplace_back<jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                      ((vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
                        *)local_228,(AST **)local_1c8,&local_498);
          } while (local_558._0_4_ != BRACKET_R);
        }
        pop((Token *)local_478,this);
        pAVar1 = this->alloc;
        local_1c8._0_8_ = &local_1b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,local_2f0.location.file._M_dataplus._M_p,
                   local_2f0.location.file._M_dataplus._M_p +
                   local_2f0.location.file._M_string_length);
        local_1b8.location.file._M_string_length = local_2f0.location.begin.line;
        local_1b8.location.file.field_2._M_allocated_capacity = local_2f0.location.begin.column;
        local_1b8.location.file.field_2._8_8_ = local_4d8.end.line;
        local_1b8.location.begin.line = local_4d8.end.column;
        pLVar7 = (LiteralString *)
                 Allocator::
                 make<jsonnet::internal::Array,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                           (pAVar1,(LocationRange *)local_1c8,&local_2f0.fodder,
                            (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                             *)local_228,&local_559,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)(local_478 + 8));
        if ((AST *)local_1c8._0_8_ != &local_1b8) {
          operator_delete((void *)local_1c8._0_8_,(long)local_1b8._vptr_AST + 1);
        }
        Token::~Token((Token *)local_478);
        std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   *)local_228);
      }
      pvVar9 = &local_498;
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(pvVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8.file._M_dataplus._M_p != &local_4d8.file.field_2) {
      operator_delete(local_4d8.file._M_dataplus._M_p,
                      local_4d8.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_p != &local_4e8) {
      operator_delete(local_4f8._M_p,local_4e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_p != &local_508) {
      operator_delete(local_518._M_p,local_508._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(auStack_530 + 8)) {
      operator_delete(local_538._M_p,auStack_530._8_8_ + 1);
    }
    pvVar9 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)(local_558 + 8);
    goto LAB_0019a278;
  case DOLLAR:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Dollar,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder);
    break;
  case PAREN_L:
    local_1c8._0_8_ = parse(this,0xf);
    popExpect((Token *)local_478,this,PAREN_R,(char *)0x0);
    pAVar1 = this->alloc;
    local_558._0_8_ = (AST *)local_548;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_558,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_538._M_p = (pointer)local_2f0.location.begin.line;
    auStack_530._0_8_ = local_2f0.location.begin.column;
    auStack_530._8_8_ = local_3c8;
    auStack_530._16_8_ = uStack_3c0;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Parens,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)local_558,&local_2f0.fodder,(AST **)local_1c8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)(local_478 + 8));
    if ((AST *)local_558._0_8_ != (AST *)local_548) {
      operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
    }
    goto LAB_00199e11;
  case IDENTIFIER:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    this_00 = this->alloc;
    Token::data32_abi_cxx11_((UString *)local_558,&local_2f0);
    local_1c8._0_8_ = Allocator::makeIdentifier(this_00,(UString *)local_558);
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,(Identifier **)local_1c8
                       );
    if ((AST *)local_558._0_8_ != (AST *)local_548) {
      operator_delete((void *)local_558._0_8_,local_548._0_8_ * 4 + 4);
    }
    goto LAB_00199723;
  case NUMBER:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::string&>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,&local_2f0.data);
    break;
  case OPERATOR:
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::UnaryOp>_>_>
                    *)(anonymous_namespace)::unary_map_abi_cxx11_,&local_2f0.data);
    if (iVar5._M_node == (_Base_ptr)((anonymous_namespace)::unary_map_abi_cxx11_ + 8)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_478);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_478 + 0x10),"not a unary operator: ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_478 + 0x10),local_2f0.data._M_dataplus._M_p,
                 local_2f0.data._M_string_length);
      pSVar8 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar8,&local_2f0.location,(string *)local_558);
      __cxa_throw(pSVar8,&StaticError::typeinfo,StaticError::~StaticError);
    }
    local_1c8._0_4_ = iVar5._M_node[2]._M_color;
    pAVar6 = parse(this,4);
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    local_558._0_8_ = pAVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._M_allocated_capacity = (pAVar6->location).end.line;
    local_448._8_8_ = (pAVar6->location).end.column;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Unary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp&,jsonnet::internal::AST*&>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,(UnaryOp *)local_1c8,
                        (AST **)local_558);
LAB_00199723:
    if ((LiteralString *)local_478._0_8_ == (LiteralString *)(local_478 + 0x10)) goto LAB_0019a27d;
    goto LAB_00199a49;
  case STRING_DOUBLE:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    Token::data32_abi_cxx11_((UString *)local_558,&local_2f0);
    local_1c8._0_4_ = 1;
    pLVar7 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_558,(TokenKind *)local_1c8,(char (*) [1])0x25e3ad,
                        (char (*) [1])0x25e3ad);
    goto LAB_00199875;
  case STRING_SINGLE:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    Token::data32_abi_cxx11_((UString *)local_558,&local_2f0);
    local_1c8._0_8_ = (ulong)(uint)local_1c8._4_4_ << 0x20;
    pLVar7 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_558,(TokenKind *)local_1c8,(char (*) [1])0x25e3ad,
                        (char (*) [1])0x25e3ad);
    goto LAB_00199875;
  case STRING_BLOCK:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    Token::data32_abi_cxx11_((UString *)local_558,&local_2f0);
    local_1c8._0_4_ = 2;
    pLVar7 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,std::__cxx11::string&,std::__cxx11::string&>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_558,(TokenKind *)local_1c8,&local_2f0.stringBlockIndent,
                        &local_2f0.stringBlockTermIndent);
    goto LAB_00199875;
  case VERBATIM_STRING_SINGLE:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    Token::data32_abi_cxx11_((UString *)local_558,&local_2f0);
    local_1c8._0_4_ = 3;
    pLVar7 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_558,(TokenKind *)local_1c8,(char (*) [1])0x25e3ad,
                        (char (*) [1])0x25e3ad);
    goto LAB_00199875;
  case VERBATIM_STRING_DOUBLE:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    Token::data32_abi_cxx11_((UString *)local_558,&local_2f0);
    local_1c8._0_4_ = 4;
    pLVar7 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_558,(TokenKind *)local_1c8,(char (*) [1])0x25e3ad,
                        (char (*) [1])0x25e3ad);
LAB_00199875:
    if ((AST *)local_558._0_8_ != (AST *)local_548) {
      operator_delete((void *)local_558._0_8_,local_548._0_8_ * 4 + 4);
    }
    break;
  case FALSE:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,(bool *)local_558);
    break;
  case NULL_LIT:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder);
    break;
  case SELF:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Self,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder);
    break;
  case SUPER:
    Token::Token((Token *)local_478,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    local_498.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228._16_8_ = (pointer)0x0;
    local_228._0_8_ = (pointer)0x0;
    local_228._8_8_ = (pointer)0x0;
    if (local_478._0_4_ == BRACKET_L) {
      local_498.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)parse(this,0xf);
      popExpect((Token *)local_558,this,BRACKET_R,(char *)0x0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)local_228,
                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)(local_558 + 8));
    }
    else {
      if (local_478._0_4_ != DOT) {
        pSVar8 = (StaticError *)__cxa_allocate_exception(0x60);
        local_558._0_8_ = local_548;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_558,"expected . or [ after super.","");
        StaticError::StaticError(pSVar8,&local_2f0.location,(string *)local_558);
        __cxa_throw(pSVar8,&StaticError::typeinfo,StaticError::~StaticError);
      }
      popExpect((Token *)local_558,this,IDENTIFIER,(char *)0x0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)local_228,
                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)(local_558 + 8));
      pAVar1 = this->alloc;
      Token::data32_abi_cxx11_((UString *)local_1c8,(Token *)local_558);
      local_1e8.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)Allocator::makeIdentifier(pAVar1,(UString *)local_1c8);
      if ((AST *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(long)local_1b8._vptr_AST * 4 + 4);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8.file._M_dataplus._M_p != &local_4d8.file.field_2) {
      operator_delete(local_4d8.file._M_dataplus._M_p,
                      local_4d8.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_p != &local_4e8) {
      operator_delete(local_4f8._M_p,local_4e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_p != &local_508) {
      operator_delete(local_518._M_p,local_508._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(auStack_530 + 8)) {
      operator_delete(local_538._M_p,auStack_530._8_8_ + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)(local_558 + 8));
    pAVar1 = this->alloc;
    local_558._0_8_ = (AST *)local_548;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_558,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_538._M_p = (pointer)local_2f0.location.begin.line;
    auStack_530._0_8_ = local_2f0.location.begin.column;
    auStack_530._8_8_ = local_2f0.location.end.line;
    auStack_530._16_8_ = local_2f0.location.end.column;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::SuperIndex,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                       (pAVar1,(LocationRange *)local_558,&local_2f0.fodder,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)(local_478 + 8),(AST **)&local_498,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)local_228,(Identifier **)&local_1e8);
    if ((AST *)local_558._0_8_ != (AST *)local_548) {
      operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_228);
LAB_00199e11:
    pvVar9 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)(local_478 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_p != local_3e8) {
      operator_delete(local_3f8._M_p,local_3e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_p != &local_428) {
      operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_p != &local_448) {
      operator_delete(local_458._M_p,local_448._0_8_ + 1);
    }
LAB_0019a278:
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(pvVar9);
    goto LAB_0019a27d;
  case TRUE:
    pAVar1 = this->alloc;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,local_2f0.location.file._M_dataplus._M_p,
               local_2f0.location.file._M_dataplus._M_p + local_2f0.location.file._M_string_length);
    local_458._M_p = (pointer)local_2f0.location.begin.line;
    uStack_450 = local_2f0.location.begin.column;
    local_448._0_8_ = local_2f0.location.end.line;
    local_448._8_8_ = local_2f0.location.end.column;
    local_558[0] = 1;
    pLVar7 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
                       (pAVar1,(LocationRange *)local_478,&local_2f0.fodder,(bool *)local_558);
    break;
  case END_OF_FILE:
    pSVar8 = (StaticError *)__cxa_allocate_exception(0x60);
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"unexpected end of file.","");
    StaticError::StaticError(pSVar8,&local_2f0.location,(string *)local_478);
    __cxa_throw(pSVar8,&StaticError::typeinfo,StaticError::~StaticError);
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"INTERNAL ERROR: Unknown tok kind: ",0x22);
    internal::operator<<((ostream *)&std::cerr,local_2f0.kind);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    abort();
  }
  if ((LiteralString *)local_478._0_8_ != (LiteralString *)(local_478 + 0x10)) {
LAB_00199a49:
    operator_delete((void *)local_478._0_8_,local_468._M_allocated_capacity + 1);
  }
LAB_0019a27d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.location.file._M_dataplus._M_p != &local_2f0.location.file.field_2) {
    operator_delete(local_2f0.location.file._M_dataplus._M_p,
                    local_2f0.location.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.stringBlockTermIndent._M_dataplus._M_p !=
      &local_2f0.stringBlockTermIndent.field_2) {
    operator_delete(local_2f0.stringBlockTermIndent._M_dataplus._M_p,
                    local_2f0.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.stringBlockIndent._M_dataplus._M_p != &local_2f0.stringBlockIndent.field_2) {
    operator_delete(local_2f0.stringBlockIndent._M_dataplus._M_p,
                    local_2f0.stringBlockIndent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.data._M_dataplus._M_p != &local_2f0.data.field_2) {
    operator_delete(local_2f0.data._M_dataplus._M_p,local_2f0.data.field_2._M_allocated_capacity + 1
                   );
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_2f0.fodder);
  return &pLVar7->super_AST;
}

Assistant:

AST *parseTerminalBracketsOrUnary(void)
    {
        Token tok = pop();
        switch (tok.kind) {
            case Token::ASSERT:
            case Token::BRACE_R:
            case Token::BRACKET_R:
            case Token::COMMA:
            case Token::DOT:
            case Token::ELSE:
            case Token::ERROR:
            case Token::FOR:
            case Token::FUNCTION:
            case Token::IF:
            case Token::IN:
            case Token::IMPORT:
            case Token::IMPORTSTR:
            case Token::IMPORTBIN:
            case Token::LOCAL:
            case Token::PAREN_R:
            case Token::SEMICOLON:
            case Token::TAILSTRICT:
            case Token::THEN: throw unexpected(tok, "parsing terminal");

            case Token::END_OF_FILE: throw StaticError(tok.location, "unexpected end of file.");

            case Token::OPERATOR: {
                UnaryOp uop;
                if (!op_is_unary(tok.data, uop)) {
                    std::stringstream ss;
                    ss << "not a unary operator: " << tok.data;
                    throw StaticError(tok.location, ss.str());
                }
                AST *expr = parse(UNARY_PRECEDENCE);
                return alloc->make<Unary>(span(tok, expr), tok.fodder, uop, expr);
            }
            case Token::BRACE_L: {
                AST *obj;
                parseObjectRemainder(obj, tok);
                return obj;
            }

            case Token::BRACKET_L: {
                Token next = peek();
                if (next.kind == Token::BRACKET_R) {
                    Token bracket_r = pop();
                    return alloc->make<Array>(
                        span(tok, next), tok.fodder, Array::Elements{}, false, bracket_r.fodder);
                }
                AST *first = parse(MAX_PRECEDENCE);
                bool got_comma = false;
                Fodder comma_fodder;
                next = peek();
                if (!got_comma && next.kind == Token::COMMA) {
                    Token comma = pop();
                    comma_fodder = comma.fodder;
                    next = peek();
                    got_comma = true;
                }

                if (next.kind == Token::FOR) {
                    // It's a comprehension
                    Token for_token = pop();
                    std::vector<ComprehensionSpec> specs;
                    Token last = parseComprehensionSpecs(Token::BRACKET_R, for_token.fodder, specs);
                    return alloc->make<ArrayComprehension>(span(tok, last),
                                                           tok.fodder,
                                                           first,
                                                           comma_fodder,
                                                           got_comma,
                                                           specs,
                                                           last.fodder);
                }

                // Not a comprehension: It can have more elements.
                Array::Elements elements;
                elements.emplace_back(first, comma_fodder);
                do {
                    if (next.kind == Token::BRACKET_R) {
                        Token bracket_r = pop();
                        return alloc->make<Array>(
                            span(tok, next), tok.fodder, elements, got_comma, bracket_r.fodder);
                    }
                    if (!got_comma) {
                        std::stringstream ss;
                        ss << "expected a comma before next array element.";
                        throw StaticError(next.location, ss.str());
                    }
                    AST *expr = parse(MAX_PRECEDENCE);
                    comma_fodder.clear();
                    got_comma = false;
                    next = peek();
                    if (next.kind == Token::COMMA) {
                        Token comma = pop();
                        comma_fodder = comma.fodder;
                        next = peek();
                        got_comma = true;
                    }
                    elements.emplace_back(expr, comma_fodder);
                } while (true);
            }

            case Token::PAREN_L: {
                auto *inner = parse(MAX_PRECEDENCE);
                Token close = popExpect(Token::PAREN_R);
                return alloc->make<Parens>(span(tok, close), tok.fodder, inner, close.fodder);
            }

            // Literals
            case Token::NUMBER: return alloc->make<LiteralNumber>(span(tok), tok.fodder, tok.data);

            case Token::STRING_SINGLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::SINGLE, "", "");
            case Token::STRING_DOUBLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::DOUBLE, "", "");
            case Token::STRING_BLOCK:
                return alloc->make<LiteralString>(span(tok),
                                                  tok.fodder,
                                                  tok.data32(),
                                                  LiteralString::BLOCK,
                                                  tok.stringBlockIndent,
                                                  tok.stringBlockTermIndent);
            case Token::VERBATIM_STRING_SINGLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::VERBATIM_SINGLE, "", "");
            case Token::VERBATIM_STRING_DOUBLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::VERBATIM_DOUBLE, "", "");

            case Token::FALSE: return alloc->make<LiteralBoolean>(span(tok), tok.fodder, false);

            case Token::TRUE: return alloc->make<LiteralBoolean>(span(tok), tok.fodder, true);

            case Token::NULL_LIT: return alloc->make<LiteralNull>(span(tok), tok.fodder);

            // Variables
            case Token::DOLLAR: return alloc->make<Dollar>(span(tok), tok.fodder);

            case Token::IDENTIFIER:
                return alloc->make<Var>(span(tok), tok.fodder, alloc->makeIdentifier(tok.data32()));

            case Token::SELF: return alloc->make<Self>(span(tok), tok.fodder);

            case Token::SUPER: {
                Token next = pop();
                AST *index = nullptr;
                const Identifier *id = nullptr;
                Fodder id_fodder;
                switch (next.kind) {
                    case Token::DOT: {
                        Token field_id = popExpect(Token::IDENTIFIER);
                        id_fodder = field_id.fodder;
                        id = alloc->makeIdentifier(field_id.data32());
                    } break;
                    case Token::BRACKET_L: {
                        index = parse(MAX_PRECEDENCE);
                        Token bracket_r = popExpect(Token::BRACKET_R);
                        id_fodder = bracket_r.fodder;  // Not id_fodder, but use the same var.
                    } break;
                    default: throw StaticError(tok.location, "expected . or [ after super.");
                }
                return alloc->make<SuperIndex>(
                    span(tok), tok.fodder, next.fodder, index, id_fodder, id);
            }
        }

        std::cerr << "INTERNAL ERROR: Unknown tok kind: " << tok.kind << std::endl;
        std::abort();
        return nullptr;  // Quiet, compiler.
    }